

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void mbedtls_ssl_reset_checksum(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_md5_starts(&ssl->handshake->fin_md5);
  mbedtls_sha1_starts(&ssl->handshake->fin_sha1);
  mbedtls_sha256_starts(&ssl->handshake->fin_sha256,0);
  mbedtls_sha512_starts(&ssl->handshake->fin_sha512,1);
  return;
}

Assistant:

void mbedtls_ssl_reset_checksum( mbedtls_ssl_context *ssl )
{
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
     mbedtls_md5_starts( &ssl->handshake->fin_md5  );
    mbedtls_sha1_starts( &ssl->handshake->fin_sha1 );
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
#if defined(MBEDTLS_SHA256_C)
    mbedtls_sha256_starts( &ssl->handshake->fin_sha256, 0 );
#endif
#if defined(MBEDTLS_SHA512_C)
    mbedtls_sha512_starts( &ssl->handshake->fin_sha512, 1 );
#endif
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
}